

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::SmallVector
          (SmallVector<unsigned_int,_2UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint *puVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_24;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  SmallVector<unsigned_int,_2UL> *this_local;
  
  local_18 = vec;
  vec_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  SmallVector(this);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
  if (sVar2 < 3) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
    this->size_ = sVar2;
    for (local_24 = 0; (ulong)local_24 < this->size_; local_24 = local_24 + 1) {
      puVar1 = this->small_data_;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)local_24);
      puVar1[local_24] = *pvVar3;
    }
  }
  else {
    MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
              ((spvtools *)&stack0xffffffffffffffe0,local_18);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator=(&this->large_data_,
                (unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&stack0xffffffffffffffe0);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

SmallVector(const std::vector<T>& vec) : SmallVector() {
    if (vec.size() > small_size) {
      large_data_ = MakeUnique<std::vector<T>>(vec);
    } else {
      size_ = vec.size();
      for (uint32_t i = 0; i < size_; i++) {
        new (small_data_ + i) T(vec[i]);
      }
    }
  }